

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSave.cpp
# Opt level: O2

void __thiscall
Hpipe::InstructionSave::InstructionSave(InstructionSave *this,Context *cx,uint num_save)

{
  Context CStack_88;
  
  Context::Context(&CStack_88,cx);
  Instruction::Instruction(&this->super_Instruction,&CStack_88);
  Context::~Context(&CStack_88);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__Instruction_001978a0;
  *(uint *)&(this->super_Instruction).field_0x174 = num_save;
  return;
}

Assistant:

InstructionSave::InstructionSave( const Context &cx, unsigned num_save ) : Instruction( cx ), num_save( num_save ) {

}